

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventThread.cpp
# Opt level: O0

void __thiscall EventThread::~EventThread(EventThread *this)

{
  Event *this_00;
  EventThread *this_local;
  
  (this->super_EventDispatcher).super_IEventDispatcher._vptr_IEventDispatcher =
       (_func_int **)&PTR_sendEventSync_00147348;
  this_00 = (Event *)operator_new(0x18,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventThread.cpp"
                                  ,0x2e);
  Event::Event(this_00,-2,1);
  EventDispatcher::sendEvent(&this->super_EventDispatcher,this_00);
  JHThread::Thread::Join(&(this->mThread).super_Thread);
  JHThread::Runnable<EventThread>::~Runnable(&this->mThread);
  EventDispatcher::~EventDispatcher(&this->super_EventDispatcher);
  return;
}

Assistant:

EventThread::~EventThread()
{
	TRACE_BEGIN( LOG_LVL_INFO );
	EventDispatcher::sendEvent( jh_new Event( Event::kShutdownEventId, PRIORITY_HIGH ) );
	LOG_NOISE( "Wait for thread to die" );
	mThread.Join();
}